

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_gen.cpp
# Opt level: O0

void __thiscall crn::corpus_gen::sort_blocks(corpus_gen *this,image_u8 *img)

{
  uint uVar1;
  uint uVar2;
  uint size;
  uint uVar3;
  uint height;
  color_quad<unsigned_char,_int> *pcVar4;
  float *pfVar5;
  uint *puVar6;
  uint *pIndices1;
  color_quad<unsigned_char,_int> *this_00;
  double dVar7;
  color_quad<unsigned_char,_int> *local_258;
  color_quad<unsigned_char,_int> *local_1d8;
  color_quad_u8 *c_2;
  uint local_1c0;
  uint x_2;
  uint y_2;
  uint src_block_index_1;
  color_quad_u8 *c_1;
  uint x_1;
  uint y_1;
  uint64 error;
  uint src_block_index_2;
  uint i_3;
  uint64 best_error;
  uint best_index;
  uint bx_1;
  color_quad_u8 match_block [16];
  uint local_140;
  uint local_13c;
  uint i_2;
  uint by_1;
  vector<unsigned_int> remaining_blocks;
  uint dst_block_y;
  uint dst_block_x;
  uint src_block_y;
  uint src_block_x;
  uint src_block_index;
  uint i_1;
  uint dst_block_index;
  image_u8 new_img;
  uint *pIndices;
  vector<unsigned_int> block_indices1;
  vector<unsigned_int> block_indices0;
  double dStack_a8;
  uint i;
  double std_dev;
  uint local_98;
  uint x;
  uint y;
  color_quad<unsigned_char,_int> local_88 [2];
  color_quad_u8 c [16];
  uint local_40;
  uint local_3c;
  uint bx;
  uint by;
  vector<float> block_std_dev;
  uint total_blocks;
  uint num_blocks_y;
  uint num_blocks_x;
  image_u8 *img_local;
  corpus_gen *this_local;
  
  uVar2 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img);
  size = uVar2 >> 2;
  uVar2 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_height(img);
  uVar3 = uVar2 >> 2;
  block_std_dev.m_capacity = size * uVar3;
  crnlib::console::printf("Sorting %u blocks...",(ulong)block_std_dev.m_capacity);
  crnlib::vector<float>::vector((vector<float> *)&bx,block_std_dev.m_capacity);
  for (local_3c = 0; local_3c < uVar3; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < size; local_40 = local_40 + 1) {
      local_1d8 = local_88;
      do {
        crnlib::color_quad<unsigned_char,_int>::color_quad(local_1d8);
        local_1d8 = local_1d8 + 1;
      } while (local_1d8 != c + 0xe);
      for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
        for (std_dev._4_4_ = 0; std_dev._4_4_ < 4; std_dev._4_4_ = std_dev._4_4_ + 1) {
          pcVar4 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                             (img,std_dev._4_4_ + local_40 * 4,local_98 + local_3c * 4);
          crnlib::color_quad<unsigned_char,_int>::operator=
                    (c + ((ulong)(std_dev._4_4_ + local_98 * 4) - 2),pcVar4);
        }
      }
      dStack_a8 = 0.0;
      for (block_indices0.m_capacity = 0; block_indices0.m_capacity < 3;
          block_indices0.m_capacity = block_indices0.m_capacity + 1) {
        dVar7 = crnlib::image_utils::compute_std_dev(0x10,local_88,block_indices0.m_capacity,1);
        dStack_a8 = dVar7 + dStack_a8;
      }
      pfVar5 = crnlib::vector<float>::operator[]((vector<float> *)&bx,local_40 + local_3c * size);
      *pfVar5 = (float)dStack_a8;
    }
  }
  crnlib::vector<unsigned_int>::vector
            ((vector<unsigned_int> *)&block_indices1.m_size,block_std_dev.m_capacity);
  crnlib::vector<unsigned_int>::vector((vector<unsigned_int> *)&pIndices,block_std_dev.m_capacity);
  uVar2 = block_std_dev.m_capacity;
  puVar6 = crnlib::vector<unsigned_int>::operator[]
                     ((vector<unsigned_int> *)&block_indices1.m_size,0);
  pIndices1 = crnlib::vector<unsigned_int>::operator[]((vector<unsigned_int> *)&pIndices,0);
  pfVar5 = crnlib::vector<float>::operator[]((vector<float> *)&bx,0);
  new_img.m_pixel_buf._8_8_ =
       crnlib::indirect_radix_sort<unsigned_int,float>(uVar2,puVar6,pIndices1,pfVar5,0,4,true);
  uVar2 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_width(img);
  height = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::get_height(img);
  crnlib::color_quad<unsigned_char,_int>::make_black();
  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)&dst_block_index,uVar2,height,
             0xffffffff,(color_quad<unsigned_char,_int> *)&i_1,0xf);
  src_block_index = 0;
  for (src_block_x = 0; src_block_x < block_std_dev.m_capacity; src_block_x = src_block_x + 1) {
    uVar1 = *(uint *)(new_img.m_pixel_buf._8_8_ + (ulong)src_block_x * 4);
    remaining_blocks.m_capacity = src_block_index % size;
    remaining_blocks.m_size = src_block_index / size;
    crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::unclipped_blit
              ((image<crnlib::color_quad<unsigned_char,_int>_> *)&dst_block_index,uVar1 % size << 2,
               uVar1 / size << 2,4,4,remaining_blocks.m_capacity << 2,remaining_blocks.m_size << 2,
               img);
    src_block_index = src_block_index + 1;
  }
  crnlib::vector<unsigned_int>::vector((vector<unsigned_int> *)&i_2,size);
  crnlib::console::printf("Arranging %u blocks...",(ulong)block_std_dev.m_capacity);
  for (local_13c = 0; local_13c < uVar3; local_13c = local_13c + 1) {
    crnlib::console::printf("%u of %u",(ulong)local_13c,(ulong)uVar3);
    crnlib::vector<unsigned_int>::resize((vector<unsigned_int> *)&i_2,size,false);
    for (local_140 = 0; local_140 < size; local_140 = local_140 + 1) {
      puVar6 = crnlib::vector<unsigned_int>::operator[]((vector<unsigned_int> *)&i_2,local_140);
      *puVar6 = local_140;
    }
    local_258 = (color_quad<unsigned_char,_int> *)&best_index;
    do {
      crnlib::color_quad<unsigned_char,_int>::color_quad(local_258);
      local_258 = local_258 + 1;
    } while (local_258 != match_block + 0xe);
    crnlib::utils::zero_object<crnlib::color_quad<unsigned_char,int>[16]>
              ((color_quad<unsigned_char,_int> (*) [16])&best_index);
    for (best_error._4_4_ = 0; best_error._4_4_ < size; best_error._4_4_ = best_error._4_4_ + 1) {
      best_error._0_4_ = 0;
      _src_block_index_2 = 0xffffffffffffffff;
      error._4_4_ = 0;
      while( true ) {
        uVar2 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)&i_2);
        if (uVar2 <= error._4_4_) break;
        puVar6 = crnlib::vector<unsigned_int>::operator[]((vector<unsigned_int> *)&i_2,error._4_4_);
        uVar1 = *puVar6;
        _x_1 = 0;
        for (c_1._4_4_ = 0; c_1._4_4_ < 4; c_1._4_4_ = c_1._4_4_ + 1) {
          for (c_1._0_4_ = 0; (uint)c_1 < 4; c_1._0_4_ = (uint)c_1 + 1) {
            pcVar4 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                               ((image<crnlib::color_quad<unsigned_char,_int>_> *)&dst_block_index,
                                (uint)c_1 + uVar1 * 4,c_1._4_4_ + local_13c * 4);
            uVar2 = crnlib::color::elucidian_distance
                              (pcVar4,(color_quad_u8 *)(&best_index + ((uint)c_1 + c_1._4_4_ * 4)),
                               false);
            _x_1 = uVar2 + _x_1;
          }
        }
        if (_x_1 < _src_block_index_2) {
          _src_block_index_2 = _x_1;
          best_error._0_4_ = error._4_4_;
        }
        error._4_4_ = error._4_4_ + 1;
      }
      puVar6 = crnlib::vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)&i_2,(uint)best_error);
      uVar1 = *puVar6;
      for (local_1c0 = 0; local_1c0 < 4; local_1c0 = local_1c0 + 1) {
        for (c_2._4_4_ = 0; c_2._4_4_ < 4; c_2._4_4_ = c_2._4_4_ + 1) {
          pcVar4 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                             ((image<crnlib::color_quad<unsigned_char,_int>_> *)&dst_block_index,
                              c_2._4_4_ + uVar1 * 4,local_1c0 + local_13c * 4);
          crnlib::color_quad<unsigned_char,_int>::operator=
                    ((color_quad<unsigned_char,_int> *)(&best_index + (c_2._4_4_ + local_1c0 * 4)),
                     pcVar4);
          this_00 = crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                              (img,c_2._4_4_ + best_error._4_4_ * 4,local_1c0 + local_13c * 4);
          crnlib::color_quad<unsigned_char,_int>::operator=(this_00,pcVar4);
        }
      }
      crnlib::vector<unsigned_int>::erase_unordered((vector<unsigned_int> *)&i_2,(uint)best_error);
    }
  }
  crnlib::vector<unsigned_int>::~vector((vector<unsigned_int> *)&i_2);
  crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::~image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)&dst_block_index);
  crnlib::vector<unsigned_int>::~vector((vector<unsigned_int> *)&pIndices);
  crnlib::vector<unsigned_int>::~vector((vector<unsigned_int> *)&block_indices1.m_size);
  crnlib::vector<float>::~vector((vector<float> *)&bx);
  return;
}

Assistant:

void corpus_gen::sort_blocks(image_u8& img)
    {
        const uint num_blocks_x = img.get_width() / 4;
        const uint num_blocks_y = img.get_height() / 4;
        const uint total_blocks = num_blocks_x * num_blocks_y;

        console::printf("Sorting %u blocks...", total_blocks);

        crnlib::vector<float> block_std_dev(total_blocks);

        for (uint by = 0; by < num_blocks_y; by++)
        {
            for (uint bx = 0; bx < num_blocks_x; bx++)
            {
                color_quad_u8 c[4 * 4];

                for (uint y = 0; y < 4; y++)
                {
                    for (uint x = 0; x < 4; x++)
                    {
                        c[x + y * 4] = img(bx * 4 + x, by * 4 + y);
                    }
                }

                double std_dev = 0.0f;
                for (uint i = 0; i < 3; i++)
                {
                    std_dev += image_utils::compute_std_dev(16, c, i, 1);
                }

                block_std_dev[bx + by * num_blocks_x] = (float)std_dev;
            }
        }

        crnlib::vector<uint> block_indices0(total_blocks);
        crnlib::vector<uint> block_indices1(total_blocks);

        const uint* pIndices = indirect_radix_sort(total_blocks, &block_indices0[0], &block_indices1[0], &block_std_dev[0], 0, sizeof(float), true);

        image_u8 new_img(img.get_width(), img.get_height());

        uint dst_block_index = 0;

        //float prev_std_dev = -999;
        for (uint i = 0; i < total_blocks; i++)
        {
            uint src_block_index = pIndices[i];

            //float std_dev = block_std_dev[src_block_index];
            //crnlib_ASSERT(std_dev >= prev_std_dev);
            //prev_std_dev = std_dev;

            uint src_block_x = src_block_index % num_blocks_x;
            uint src_block_y = src_block_index / num_blocks_x;

            uint dst_block_x = dst_block_index % num_blocks_x;
            uint dst_block_y = dst_block_index / num_blocks_x;

            new_img.unclipped_blit(src_block_x * 4, src_block_y * 4, 4, 4, dst_block_x * 4, dst_block_y * 4, img);

            dst_block_index++;
        }

#if 0
        //new_img.swap(img);
#else
        crnlib::vector<uint> remaining_blocks(num_blocks_x);

        console::printf("Arranging %u blocks...", total_blocks);

        for (uint by = 0; by < num_blocks_y; by++)
        {
            console::printf("%u of %u", by, num_blocks_y);

            remaining_blocks.resize(num_blocks_x);
            for (uint i = 0; i < num_blocks_x; i++)
            {
                remaining_blocks[i] = i;
            }

            color_quad_u8 match_block[16];
            utils::zero_object(match_block);
            for (uint bx = 0; bx < num_blocks_x; bx++)
            {
                uint best_index = 0;

                uint64 best_error = cUINT64_MAX;

                for (uint i = 0; i < remaining_blocks.size(); i++)
                {
                    uint src_block_index = remaining_blocks[i];

                    uint64 error = 0;
                    for (uint y = 0; y < 4; y++)
                    {
                        for (uint x = 0; x < 4; x++)
                        {
                            const color_quad_u8& c = new_img(src_block_index * 4 + x, by * 4 + y);
                            error += color::elucidian_distance(c, match_block[x + y * 4], false);
                        }
                    }

                    if (error < best_error)
                    {
                        best_error = error;
                        best_index = i;
                    }
                }

                uint src_block_index = remaining_blocks[best_index];

                for (uint y = 0; y < 4; y++)
                {
                    for (uint x = 0; x < 4; x++)
                    {
                        const color_quad_u8& c = new_img(src_block_index * 4 + x, by * 4 + y);
                        match_block[x + y * 4] = c;

                        img(bx * 4 + x, by * 4 + y) = c;
                    }
                }

                remaining_blocks.erase_unordered(best_index);
            }
        }
#endif
    }